

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O0

Symbol * slang::ast::GenericClassDefSymbol::fromSyntax(Scope *scope,ClassDeclarationSyntax *syntax)

{
  Compilation *args_1;
  Compilation *this;
  SourceLocation args;
  GenericClassDefSymbol *this_00;
  SyntaxNode *in_RSI;
  Scope *in_RDI;
  string_view sVar1;
  SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl> *in_stack_00000020;
  GenericClassDefSymbol *result;
  Compilation *comp;
  Token *in_stack_ffffffffffffffd0;
  
  args_1 = Scope::getCompilation(in_RDI);
  sVar1 = parsing::Token::valueText(in_stack_ffffffffffffffd0);
  this = (Compilation *)sVar1._M_len;
  args = parsing::Token::location((Token *)(in_RSI + 5));
  this_00 = Compilation::
            allocGenericClass<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                      (this,(basic_string_view<char,_std::char_traits<char>_> *)args,
                       (SourceLocation *)args_1);
  Symbol::setSyntax(&this_00->super_Symbol,in_RSI);
  if (*(short *)&in_RSI[3].parent == 200) {
    this_00->isInterface = true;
  }
  ParameterBuilder::createDecls((Scope *)comp,(ParameterPortListSyntax *)result,in_stack_00000020);
  return &this_00->super_Symbol;
}

Assistant:

const Symbol& GenericClassDefSymbol::fromSyntax(const Scope& scope,
                                                const ClassDeclarationSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto result = comp.allocGenericClass(syntax.name.valueText(), syntax.name.location());
    result->setSyntax(syntax);

    if (syntax.virtualOrInterface.kind == TokenKind::InterfaceKeyword)
        result->isInterface = true;

    // Extract information about parameters and save it for later use
    // when building specializations.
    SLANG_ASSERT(syntax.parameters);
    ParameterBuilder::createDecls(scope, *syntax.parameters, result->paramDecls);

    return *result;
}